

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

qreal __thiscall QTextEdit::fontPointSize(QTextEdit *this)

{
  long in_FS_OFFSET;
  qreal qVar1;
  QWidgetTextControl local_30 [8];
  QTextFormat local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetTextControl::textCursor(local_30);
  QTextCursor::charFormat();
  qVar1 = (qreal)QTextFormat::doubleProperty((int)local_28);
  QTextFormat::~QTextFormat(local_28);
  QTextCursor::~QTextCursor((QTextCursor *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qreal QTextEdit::fontPointSize() const
{
    Q_D(const QTextEdit);
    return d->control->textCursor().charFormat().fontPointSize();
}